

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,ImWchar c)

{
  ImWchar local_12;
  ImGuiIO *pIStack_10;
  ImWchar c_local;
  ImGuiIO *this_local;
  
  local_12 = c;
  pIStack_10 = this;
  ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_12);
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(ImWchar c)
{
    InputQueueCharacters.push_back(c);
}